

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

void __thiscall sznet::Logger::Impl::finish(Impl *this)

{
  LogStream *pLVar1;
  char **ppcVar2;
  ulong uVar3;
  char *pcVar4;
  ulong __n;
  
  ppcVar2 = &(this->m_stream).m_buffer.m_cur;
  pcVar4 = (this->m_stream).m_buffer.m_cur;
  uVar3 = (long)ppcVar2 - (long)pcVar4;
  if ((uVar3 & 0xfffffffc) != 0) {
    pcVar4[2] = ' ';
    pcVar4[0] = ' ';
    pcVar4[1] = '-';
    pcVar4 = *ppcVar2 + 3;
    uVar3 = (long)ppcVar2 - (long)pcVar4;
    *ppcVar2 = pcVar4;
  }
  __n = (ulong)(this->m_basename).m_size;
  if (__n < (ulong)(long)(int)uVar3) {
    memcpy(pcVar4,(this->m_basename).m_data,__n);
    pcVar4 = (this->m_stream).m_buffer.m_cur + __n;
    uVar3 = (long)ppcVar2 - (long)pcVar4;
    (this->m_stream).m_buffer.m_cur = pcVar4;
  }
  if ((uVar3 & 0xfffffffe) != 0) {
    *pcVar4 = ':';
    *ppcVar2 = *ppcVar2 + 1;
  }
  pLVar1 = LogStream::operator<<(&this->m_stream,this->m_line);
  pcVar4 = (pLVar1->m_buffer).m_cur;
  ppcVar2 = &(pLVar1->m_buffer).m_cur;
  if (((int)ppcVar2 - (int)pcVar4 & 0xfffffffeU) != 0) {
    *pcVar4 = '\n';
    *ppcVar2 = *ppcVar2 + 1;
  }
  return;
}

Assistant:

void Logger::Impl::finish()
{
	m_stream << " - " << m_basename << ':' << m_line << '\n';
}